

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_Inter_Location_Data::Make_Unique(Am_Inter_Location_Data *this)

{
  bool bVar1;
  Am_Inter_Location_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_Inter_Location_Data *)operator_new(0x40);
    Am_Inter_Location_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

void
Am_Inter_Location_Data::Print(std::ostream &os) const
{
  os << "(";
  if (as_line) {
    os << data.line.x1 << "," << data.line.y1 << ").(" << data.line.x2 << ","
       << data.line.y2 << ")";
  } else if (growing)
    os << data.rect.left << "," << data.rect.top << "," << data.rect.width
       << "," << data.rect.height << ")";
  else
    os << data.rect.left << "," << data.rect.top << ")";
  os << " w.r.t. " << ref_obj;
}